

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O3

WatchID __thiscall
efsw::FileWatcher::addWatch(FileWatcher *this,string *directory,FileWatchListener *watcher)

{
  WatchID WVar1;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> local_28;
  
  local_28.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WVar1 = addWatch(this,directory,watcher,false,&local_28);
  if (local_28.super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return WVar1;
}

Assistant:

void FileWatcher::watch() {
	mImpl->watch();
}